

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManPropagate2(Cbs2_Man_t *p,int Level)

{
  int *piVar1;
  int Lit;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  Gia_Obj_t *pVar;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar9 = (long)(p->pProp).iHead;
LAB_005ba4b3:
  iVar2 = (p->pProp).iTail;
  if ((iVar2 <= lVar9) || (Lit = (p->pProp).pData[lVar9], Lit == 0)) {
    (p->pProp).iHead = iVar2;
    return 0;
  }
  iVar2 = Abc_LitNot(Lit);
  piVar8 = Vec_IntEntryP(&p->vWatches,Lit);
LAB_005ba500:
  do {
    iVar7 = *piVar8;
    lVar10 = (long)iVar7;
    if (lVar10 == 0) break;
    piVar1 = (p->pClauses).pData + lVar10;
    lVar12 = (long)*piVar1;
    p->nPropCalls[1] = p->nPropCalls[1] + 1;
    if (piVar1[1] == iVar2) {
      piVar1[1] = piVar1[2];
      piVar1[2] = iVar2;
      *(ulong *)(piVar1 + lVar12 + 1) =
           CONCAT44((int)*(undefined8 *)(piVar1 + lVar12 + 1),
                    (int)((ulong)*(undefined8 *)(piVar1 + lVar12 + 1) >> 0x20));
    }
    if (piVar1[2] != iVar2) {
      __assert_fail("pLits[1] == LitF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x350,"int Cbs2_ManPropagateClauses(Cbs2_Man_t *, int, int)");
    }
    iVar3 = Abc_Lit2Var(piVar1[1]);
    uVar4 = Cbs2_VarValue(p,iVar3);
    uVar5 = Abc_LitIsCompl(piVar1[1]);
    if ((uVar5 ^ uVar4) == 1) {
LAB_005ba62c:
      piVar8 = (p->pClauses).pData + lVar10;
      piVar8 = piVar8 + (long)*piVar8 + 2;
    }
    else {
      lVar11 = 2;
      do {
        if (lVar12 <= lVar11) {
          iVar3 = Abc_Lit2Var(piVar1[1]);
          iVar3 = Cbs2_VarValue(p,iVar3);
          if (1 < iVar3) {
            Cbs2_ManAssign(p,piVar1[1],Level,0,iVar7);
            goto LAB_005ba62c;
          }
          iVar6 = Abc_LitIsCompl(piVar1[1]);
          if (iVar3 != iVar6) goto LAB_005ba500;
          p->nClauseConf = p->nClauseConf + 1;
          iVar2 = Abc_Lit2Var(piVar1[1]);
          iVar2 = Cbs2_ManAnalyze(p,Level,iVar2,0,iVar7);
          if (iVar2 != 0) {
            return iVar2;
          }
          goto LAB_005ba672;
        }
        iVar3 = Abc_Lit2Var(piVar1[lVar11 + 1]);
        iVar3 = Cbs2_VarValue(p,iVar3);
        iVar6 = Abc_LitIsCompl(piVar1[lVar11 + 1]);
        lVar11 = lVar11 + 1;
      } while (iVar3 == iVar6);
      piVar1[2] = piVar1[lVar11];
      piVar1[lVar11] = iVar2;
      piVar1 = (p->pClauses).pData + lVar10;
      *piVar8 = piVar1[(long)*piVar1 + 2];
      Cbs2_ManWatchClause(p,iVar7,piVar1[2]);
    }
  } while( true );
LAB_005ba672:
  iVar2 = Abc_Lit2Var(Lit);
  for (iVar2 = Vec_IntEntry(&p->vFanout0,iVar2); iVar2 != 0;
      iVar2 = Vec_IntEntry(&p->vFanoutN,iVar2)) {
    iVar7 = Abc_Lit2Var(iVar2);
    iVar3 = Cbs2_VarIsAssigned(p,iVar7);
    if (iVar3 == 0) {
      pVar = Gia_ManObj(p->pAig,iVar7);
      if (((ulong)pVar & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x434,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
      }
      if (((int)(uint)*(undefined8 *)pVar < 0) ||
         (((uint)*(undefined8 *)pVar & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x435,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
      }
      iVar3 = Cbs2_VarIsAssigned(p,iVar7);
      if (iVar3 != 0) {
        __assert_fail("!Cbs2_VarIsAssigned(p, iVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x436,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
      }
      iVar3 = Cbs2_VarFanin0Value(p,pVar,iVar7);
      iVar6 = Cbs2_VarFanin1Value(p,pVar,iVar7);
      p->nPropCalls[2] = p->nPropCalls[2] + 1;
      if (iVar3 == 0 && iVar6 == 0) {
        iVar3 = 1;
LAB_005ba747:
        iVar3 = Abc_Var2Lit(iVar7,iVar3);
        uVar4 = (uint)*(undefined8 *)pVar;
        iVar6 = iVar7 - ((uint)((ulong)*(undefined8 *)pVar >> 0x20) & 0x1fffffff);
      }
      else {
        if (iVar3 == 0) {
          iVar3 = Abc_Var2Lit(iVar7,1);
          uVar4 = *(uint *)pVar;
        }
        else {
          if (iVar6 != 0) {
            if (iVar6 != 1 || iVar3 != 1) goto LAB_005ba7c9;
            iVar3 = 0;
            goto LAB_005ba747;
          }
          iVar3 = Abc_Var2Lit(iVar7,1);
          uVar4 = *(uint *)&pVar->field_0x4;
        }
        iVar6 = 0;
      }
      Cbs2_ManAssign(p,iVar3,Level,iVar7 - (uVar4 & 0x1fffffff),iVar6);
    }
    else {
      iVar7 = Cbs2_ManPropagateOne(p,iVar7,Level);
      if (iVar7 != 0) {
        return iVar7;
      }
    }
LAB_005ba7c9:
  }
  iVar2 = Abc_Lit2Var(Lit);
  iVar2 = Cbs2_ManPropagateOne(p,iVar2,Level);
  lVar9 = lVar9 + 1;
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_005ba4b3;
}

Assistant:

int Cbs2_ManPropagate2( Cbs2_Man_t * p, int Level )
{
    int i, iLit, iFan, hClause;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        if ( (hClause = Cbs2_ManPropagateClauses(p, Level, iLit)) )
            return hClause;
        Cbs2_ObjForEachFanout( p, Abc_Lit2Var(iLit), iFan )
        {
            int iFanout = Abc_Lit2Var(iFan);
            if ( !Cbs2_VarIsAssigned(p, iFanout) )
                Cbs2_ManPropagateUnassigned( p, iFanout, Level );
            else if ( (hClause = Cbs2_ManPropagateOne(p, iFanout, Level)) )
                return hClause;
        }
        if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
            return hClause;
    }
    p->pProp.iHead = p->pProp.iTail;
    return 0;
}